

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::Picker::_q_emitCurrentIndexChanged(Picker *this,QModelIndex *index)

{
  QString text;
  QAccessibleEvent event;
  QArrayDataPointer<char16_t> local_50;
  code *local_38;
  undefined4 local_30;
  Picker *local_28;
  undefined4 local_20;
  
  currentIndexChanged(this,index->r);
  PickerPrivate::itemText((QString *)&local_50,(this->d).d,index);
  currentIndexChanged(this,(QString *)&local_50);
  currentTextChanged(this,(QString *)&local_50);
  local_38 = std::__throw_bad_alloc;
  local_30 = 0x800c;
  local_20 = 0xffffffff;
  local_28 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_38);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  return;
}

Assistant:

void
Picker::_q_emitCurrentIndexChanged( const QModelIndex & index )
{
	emit currentIndexChanged( index.row() );

	const QString text = d->itemText( index );

	emit currentIndexChanged( text );

	emit currentTextChanged( text );

#ifndef QT_NO_ACCESSIBILITY
	QAccessibleEvent event( this, QAccessible::NameChanged );
	QAccessible::updateAccessibility( &event );
#endif
}